

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

exr_result_t
exr_attr_string_init_static_with_length(exr_context_t ctxt,exr_attr_string_t *s,char *v,int32_t len)

{
  exr_result_t eVar1;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar2;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (-1 < len) {
    if (v == (char *)0x0) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
      pcVar2 = "Invalid static string argument to initialize";
    }
    else {
      if (s != (exr_attr_string_t *)0x0) {
        s->length = 0;
        s->alloc_size = 0;
        s->length = len;
        s->str = v;
        return 0;
      }
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
      pcVar2 = "Invalid reference to string object to initialize";
    }
    eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar2);
    return eVar1;
  }
  eVar1 = (**(code **)(ctxt + 0x48))
                    (ctxt,3,"Received request to allocate negative sized string (%d)",len,
                     *(code **)(ctxt + 0x48));
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_init_static_with_length (
    exr_context_t ctxt, exr_attr_string_t* s, const char* v, int32_t len)
{
    exr_attr_string_t nil = {0};
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (len < 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized string (%d)",
            len);

    if (!v)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid static string argument to initialize");

    if (!s)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string object to initialize");

    *s        = nil;
    s->length = len;
    s->str    = v;
    return EXR_ERR_SUCCESS;
}